

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTDMT_waitForLdmComplete(ZSTDMT_CCtx *mtctx,buffer_t buffer)

{
  pthread_mutex_t *__mutex;
  uint uVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  size_t sVar4;
  BYTE *bufferEnd;
  BYTE *pBVar5;
  BYTE *pBVar6;
  uint uVar7;
  BYTE *bufferStart;
  
  sVar4 = buffer.capacity;
  pBVar5 = (BYTE *)buffer.start;
  if ((mtctx->params).ldmParams.enableLdm == ZSTD_ps_enable) {
    __mutex = &(mtctx->serial).ldmWindowMutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    while( true ) {
      pBVar2 = (mtctx->serial).ldmWindow.nextSrc;
      pBVar3 = (mtctx->serial).ldmWindow.base;
      pBVar6 = (mtctx->serial).ldmWindow.dictBase;
      uVar1 = (mtctx->serial).ldmWindow.dictLimit;
      if (((pBVar6 == (BYTE *)0x0 || pBVar5 == (BYTE *)0x0) ||
          (uVar7 = (mtctx->serial).ldmWindow.lowLimit, pBVar6 = pBVar6 + uVar7,
          uVar7 = uVar1 - uVar7,
          (pBVar5 + sVar4 <= pBVar6 || (uVar7 == 0 || sVar4 == 0)) || pBVar6 + uVar7 <= pBVar5)) &&
         (((pBVar3 == (BYTE *)0x0 ||
           (((pBVar5 == (BYTE *)0x0 || (sVar4 == 0)) || (pBVar3 = pBVar3 + uVar1, pBVar2 == pBVar3))
           )) || ((pBVar2 <= pBVar5 || (pBVar5 + sVar4 <= pBVar3)))))) break;
      pthread_cond_wait((pthread_cond_t *)&(mtctx->serial).ldmWindowCond,(pthread_mutex_t *)__mutex)
      ;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  return;
}

Assistant:

static void ZSTDMT_waitForLdmComplete(ZSTDMT_CCtx* mtctx, buffer_t buffer)
{
    if (mtctx->params.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_pthread_mutex_t* mutex = &mtctx->serial.ldmWindowMutex;
        DEBUGLOG(5, "ZSTDMT_waitForLdmComplete");
        DEBUGLOG(5, "source  [0x%zx, 0x%zx)",
                    (size_t)buffer.start,
                    (size_t)buffer.start + buffer.capacity);
        ZSTD_PTHREAD_MUTEX_LOCK(mutex);
        while (ZSTDMT_doesOverlapWindow(buffer, mtctx->serial.ldmWindow)) {
            DEBUGLOG(5, "Waiting for LDM to finish...");
            ZSTD_pthread_cond_wait(&mtctx->serial.ldmWindowCond, mutex);
        }
        DEBUGLOG(6, "Done waiting for LDM to finish");
        ZSTD_pthread_mutex_unlock(mutex);
    }
}